

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O2

sexp sexp_compare(sexp ctx,sexp a,sexp b)

{
  double dVar1;
  sexp_tag_t sVar2;
  long lVar3;
  sexp *ppsVar4;
  int iVar5;
  int iVar6;
  sexp psVar7;
  sexp_sint_t sVar8;
  sexp_uint_t sVar9;
  ulong uVar10;
  char *msg;
  double dVar11;
  sexp tmp;
  sexp_gc_var_t local_30;
  
  iVar5 = sexp_number_type(a);
  iVar6 = sexp_number_type(b);
  tmp = (sexp)&DAT_0000043e;
  local_30.next = (ctx->value).context.saves;
  (ctx->value).context.saves = &local_30;
  if (iVar6 < iVar5) {
    local_30.var = &tmp;
    psVar7 = sexp_compare(ctx,b,a);
    if (((ulong)psVar7 & 3) == 0) {
      sVar2 = psVar7->tag;
      if (sVar2 == 0x13) goto LAB_0011ab70;
      if (sVar2 == 0xc) {
        (psVar7->value).flonum_bits[0] = -(psVar7->value).flonum_bits[0];
        goto LAB_0011ab70;
      }
      if (sVar2 == 0xb) {
        (psVar7->value).stack.length = (psVar7->value).stack.length ^ 0x8000000000000000;
        goto LAB_0011ab70;
      }
    }
    if (((ulong)psVar7 & 1) != 0) {
      psVar7 = (sexp)(1 - ((ulong)psVar7 & 0xfffffffffffffffe));
    }
    goto LAB_0011ab70;
  }
  local_30.var = &tmp;
  ppsVar4 = &tmp;
  switch(iVar5 * 6 + iVar6) {
  case 0:
  case 1:
  case 2:
  case 3:
  case 0xb:
  case 0x11:
  case 0x17:
  case 0x1d:
  case 0x23:
    local_30.var = &tmp;
    psVar7 = sexp_type_exception(ctx,(sexp)0x0,3,a);
    goto LAB_0011ab70;
  default:
    msg = "unknown comparison";
    b = a;
    break;
  case 7:
    lVar3 = -((ulong)b & 0xfffffffffffffffe);
    goto LAB_0011aa20;
  case 8:
    dVar11 = (b->value).flonum;
    if (ABS(dVar11) == INFINITY) {
      uVar10 = (ulong)(dVar11 <= 0.0);
LAB_0011aacf:
      psVar7 = (sexp)(uVar10 * 4 + -1);
      goto LAB_0011ab70;
    }
    if (!NAN(dVar11)) {
      local_30.var = &tmp;
      b = sexp_inexact_to_exact(ctx,(sexp)0x0,1,b);
      tmp = b;
LAB_0011ab68:
      psVar7 = sexp_compare(ctx,a,b);
      goto LAB_0011ab70;
    }
    goto LAB_0011aba1;
  case 9:
    local_30.var = &tmp;
    sVar9 = sexp_bignum_hi(b);
    if ((1 < sVar9) || (uVar10 = (b->value).string.length, uVar10 >> 0x3e != 0)) {
      uVar10 = (ulong)((b->value).flonum_bits[0] < '\0');
      goto LAB_0011aacf;
    }
    lVar3 = uVar10 * -2;
LAB_0011aa20:
    psVar7 = (sexp)((long)&a->tag + lVar3 | 1);
    goto LAB_0011ab70;
  case 10:
  case 0x16:
    local_30.var = &tmp;
    a = sexp_make_ratio(ctx,a,(sexp)&DAT_00000003);
    tmp = a;
    ppsVar4 = local_30.var;
  case 0x1c:
    local_30.var = ppsVar4;
    psVar7 = sexp_ratio_compare(ctx,a,b);
    goto LAB_0011ab70;
  case 0xe:
    dVar11 = (a->value).flonum;
    if (NAN(dVar11)) goto LAB_0011ab95;
    dVar1 = (b->value).flonum;
    if (!NAN(dVar1)) {
      psVar7 = (sexp)0xffffffffffffffff;
      if (dVar1 <= dVar11) {
        psVar7 = (sexp)((ulong)(-(uint)(dVar11 != dVar1) & 1) * 2 + 1);
      }
      goto LAB_0011ab70;
    }
LAB_0011aba1:
    msg = "can\'t compare NaN";
    break;
  case 0xf:
    dVar11 = (a->value).flonum;
    if (ABS(dVar11) == INFINITY) {
LAB_0011aa77:
      uVar10 = (ulong)(0.0 < dVar11);
      goto LAB_0011aacf;
    }
    if (NAN(dVar11)) goto LAB_0011ab95;
    local_30.var = &tmp;
    a = sexp_double_to_bignum(ctx,dVar11);
    tmp = a;
  case 0x15:
    sVar8 = sexp_bignum_compare(a,b);
    psVar7 = (sexp)(sVar8 * 2 + 1);
    goto LAB_0011ab70;
  case 0x10:
    dVar11 = (a->value).flonum;
    if (ABS(dVar11) == INFINITY) goto LAB_0011aa77;
    if (!NAN(dVar11)) {
      local_30.var = &tmp;
      a = sexp_inexact_to_exact(ctx,(sexp)0x0,1,a);
      tmp = a;
      goto LAB_0011ab68;
    }
LAB_0011ab95:
    msg = "can\'t compare NaN";
    b = a;
  }
  local_30.var = &tmp;
  psVar7 = sexp_xtype_exception(ctx,(sexp)0x0,msg,b);
LAB_0011ab70:
  (ctx->value).context.saves = local_30.next;
  return psVar7;
}

Assistant:

sexp sexp_compare (sexp ctx, sexp a, sexp b) {
  int at=sexp_number_type(a), bt=sexp_number_type(b);
  sexp r=SEXP_VOID;
  double f, g;
  sexp_gc_var1(tmp);
  sexp_gc_preserve1(ctx, tmp);
  if (at > bt) {
    r = sexp_compare(ctx, b, a);
    if (!sexp_exceptionp(r)) { sexp_negate(r); }
  } else {
    switch ((at * SEXP_NUM_NUMBER_TYPES) + bt) {
    case SEXP_NUM_NOT_NOT: case SEXP_NUM_NOT_FIX:
    case SEXP_NUM_NOT_FLO: case SEXP_NUM_NOT_BIG:
#if SEXP_USE_COMPLEX
    case SEXP_NUM_CPX_CPX: case SEXP_NUM_FIX_CPX:
    case SEXP_NUM_FLO_CPX: case SEXP_NUM_BIG_CPX:
#if SEXP_USE_RATIOS
    case SEXP_NUM_RAT_CPX:
#endif
#endif
      r = sexp_type_exception(ctx, NULL, SEXP_NUMBER, a);
      break;
    case SEXP_NUM_FIX_FIX:
      r = sexp_make_fixnum(sexp_unbox_fixnum(a) - sexp_unbox_fixnum(b));
      break;
    case SEXP_NUM_FIX_FLO:
      if (isinf(sexp_flonum_value(b))) {
        r = sexp_flonum_value(b) > 0 ? SEXP_NEG_ONE : SEXP_ONE;
      } else if (isnan(sexp_flonum_value(b))) {
        r = sexp_xtype_exception(ctx, NULL, "can't compare NaN", b);
      } else {
        r = sexp_compare(ctx, a, tmp=sexp_inexact_to_exact(ctx, NULL, 1, b));
      }
      break;
    case SEXP_NUM_FIX_BIG:
      if ((sexp_bignum_hi(b) > 1) ||
          (sexp_bignum_data(b)[0] > SEXP_MAX_FIXNUM))
        r = sexp_make_fixnum(sexp_bignum_sign(b) < 0 ? 1 : -1);
      else
        r = sexp_make_fixnum(sexp_unbox_fixnum(a) - (sexp_sint_t)sexp_bignum_data(b)[0]);
      break;
    case SEXP_NUM_FLO_FLO:
      f = sexp_flonum_value(a);
      g = sexp_flonum_value(b);
      if (isnan(f))
        r = sexp_xtype_exception(ctx, NULL, "can't compare NaN", a);
      else if (isnan(g))
        r = sexp_xtype_exception(ctx, NULL, "can't compare NaN", b);
      else
        r = sexp_make_fixnum(f < g ? -1 : f == g ? 0 : 1);
      break;
    case SEXP_NUM_FLO_BIG:
      f = sexp_flonum_value(a);
      if (isinf(f)) {
        r = f > 0 ? SEXP_ONE : SEXP_NEG_ONE;
        break;
      } else if (isnan(f)) {
        r = sexp_xtype_exception(ctx, NULL, "can't compare NaN", a);
        break;
      } else {
        a = tmp = sexp_double_to_bignum(ctx, f);
      }
      /* ... FALLTHROUGH ... */
    case SEXP_NUM_BIG_BIG:
      r = sexp_make_fixnum(sexp_bignum_compare(a, b));
      break;
#if SEXP_USE_RATIOS
    case SEXP_NUM_FLO_RAT:
      f = sexp_flonum_value(a);
      if (isinf(f)) {
        r = f > 0 ? SEXP_ONE : SEXP_NEG_ONE;
      } else if (isnan(f)) {
        r = sexp_xtype_exception(ctx, NULL, "can't compare NaN", a);
      } else {
        r = sexp_compare(ctx, tmp=sexp_inexact_to_exact(ctx, NULL, 1, a), b);
      }
      break;
    case SEXP_NUM_FIX_RAT:
    case SEXP_NUM_BIG_RAT:
      a = tmp = sexp_make_ratio(ctx, a, SEXP_ONE);
      /* ... FALLTHROUGH ... */
    case SEXP_NUM_RAT_RAT:
      r = sexp_ratio_compare(ctx, a, b);
      break;
#endif
    default:
      r = sexp_xtype_exception(ctx, NULL, "unknown comparison", a);
      break;
    }
  }
  sexp_gc_release1(ctx);
  return r;
}